

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl> *this,
          void *pointer)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  
  if (pointer != (void *)0x0) {
    if (*(char *)((long)pointer + 0x70) == '\x01') {
      lVar1 = *(long *)((long)pointer + 0x118);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)pointer + 0x120);
        *(undefined8 *)((long)pointer + 0x118) = 0;
        *(undefined8 *)((long)pointer + 0x120) = 0;
        (**(code **)**(undefined8 **)((long)pointer + 0x128))
                  (*(undefined8 **)((long)pointer + 0x128),lVar1,0x88,uVar2,uVar2,0);
      }
      AsyncObject::~AsyncObject((AsyncObject *)((long)pointer + 0x100));
    }
    lVar1 = *(long *)((long)pointer + 0x40);
    if (lVar1 != 0) {
      lVar3 = *(long *)((long)pointer + 0x48);
      lVar4 = *(long *)((long)pointer + 0x50);
      *(undefined8 *)((long)pointer + 0x40) = 0;
      *(undefined8 *)((long)pointer + 0x48) = 0;
      *(undefined8 *)((long)pointer + 0x50) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x58))
                (*(undefined8 **)((long)pointer + 0x58),lVar1,0x18,
                 (lVar3 - lVar1 >> 3) * -0x5555555555555555,
                 (lVar4 - lVar1 >> 3) * -0x5555555555555555,0);
    }
    lVar1 = *(long *)((long)pointer + 0x28);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x30);
      *(undefined8 *)((long)pointer + 0x28) = 0;
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x38))
                (*(undefined8 **)((long)pointer + 0x38),lVar1,1,uVar2,uVar2,0);
    }
    lVar1 = *(long *)((long)pointer + 0x10);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)pointer + 0x18);
      *(undefined8 *)((long)pointer + 0x10) = 0;
      *(undefined8 *)((long)pointer + 0x18) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x20))
                (*(undefined8 **)((long)pointer + 0x20),lVar1,1,uVar2,uVar2,0);
    }
    operator_delete(pointer,0x138);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }